

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

void __thiscall
UnitTests::Assert::NotIn<int,std::vector<int,std::allocator<int>>&>
          (Assert *this,string *msg,int value,vector<int,_std::allocator<int>_> *container)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  int local_4c;
  string local_48;
  
  local_4c = value;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish,&local_4c);
  if (_Var1._M_current ==
      (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    return;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Did not expect container to contain","");
  ContainmentError<int,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (this,msg,&local_48,local_4c,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (container->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
}

Assistant:

void NotIn(const std::string& msg, Value value, Container&& container) const
        {
            if (std::find(begin(container), end(container), value) != end(container))
            {
                ContainmentError(msg, "Did not expect container to contain", value, begin(container), end(container));
            }
        }